

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

bool Omega_h::is_sorted<double>(Read<double> *a)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  type transform;
  Alloc *local_20;
  
  local_20 = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_20 & 1) == 0) {
    iVar3 = (int)(local_20->size >> 3);
  }
  else {
    iVar3 = (int)((ulong)local_20 >> 6);
  }
  bVar2 = true;
  if (1 < iVar3) {
    if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_20 = (Alloc *)(local_20->size * 8 + 1);
      }
      else {
        local_20->use_count = local_20->use_count + 1;
      }
    }
    bVar2 = transform_reduce<Omega_h::IntIterator,Omega_h::is_sorted<double>(Omega_h::Read<double>)::_lambda(int)_1_,bool,Omega_h::logical_and<bool>>
                      (0,iVar3 + -1,1);
    if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
      piVar1 = &local_20->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_20);
        operator_delete(local_20,0x48);
      }
    }
  }
  return bVar2;
}

Assistant:

Write<T> divide_each(Read<T> a, Read<T> b, std::string const& name) {
  auto width = divide_no_remainder(a.size(), b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] / b[i];
    }
  };
  parallel_for(b.size(), f, "divide_each");
  return c;
}